

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

void __thiscall
testing::internal::FunctionMocker<void_(int,_int)>::InvokeWith
          (FunctionMocker<void_(int,_int)> *this,ArgumentTuple *args)

{
  bool bVar1;
  CallReaction CVar2;
  ExpectationBase *this_00;
  ostream *poVar3;
  char *pcVar4;
  void *pvVar5;
  ArgumentTuple *args_1;
  LogSeverity severity;
  bool is_excessive;
  void *untyped_action;
  FailureCleanupHandler handle_failures;
  string local_4e8;
  stringstream ss;
  ostream local_4b8 [376];
  stringstream why;
  ostream local_330 [376];
  stringstream loc;
  ostream local_1a8 [376];
  
  if ((this->super_UntypedFunctionMockerBase).untyped_expectations_.
      super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->super_UntypedFunctionMockerBase).untyped_expectations_.
      super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    is_excessive = false;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__cxx11::stringstream::stringstream((stringstream *)&why);
    std::__cxx11::stringstream::stringstream((stringstream *)&loc);
    untyped_action = (void *)0x0;
    this_00 = UntypedFindMatchingExpectation
                        (this,args,&untyped_action,&is_excessive,local_4b8,local_330);
    if (((this_00 == (ExpectationBase *)0x0) || (is_excessive != false)) ||
       (bVar1 = LogIsVisible(kInfo), pvVar5 = untyped_action, bVar1)) {
      poVar3 = std::operator<<(local_4b8,"    Function call: ");
      pcVar4 = UntypedFunctionMockerBase::Name(&this->super_UntypedFunctionMockerBase);
      std::operator<<(poVar3,pcVar4);
      PrintTo<int,int>(args,local_4b8);
      if ((this_00 != (ExpectationBase *)0x0) && ((is_excessive & 1U) == 0)) {
        ExpectationBase::DescribeLocationTo(this_00,local_1a8);
      }
      pvVar5 = untyped_action;
      handle_failures.ss = &ss;
      handle_failures.why = &why;
      handle_failures.loc = &loc;
      handle_failures.untyped_expectation = this_00;
      handle_failures.found = this_00 != (ExpectationBase *)0x0;
      handle_failures.is_excessive = is_excessive;
      std::__cxx11::stringbuf::str();
      PerformAction(this,pvVar5,args,&local_4e8);
      std::__cxx11::string::~string((string *)&local_4e8);
      UntypedFunctionMockerBase::FailureCleanupHandler::~FailureCleanupHandler(&handle_failures);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&handle_failures,"",(allocator<char> *)&local_4e8);
      PerformAction(this,pvVar5,args,(string *)&handle_failures);
      std::__cxx11::string::~string((string *)&handle_failures);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&loc);
    std::__cxx11::stringstream::~stringstream((stringstream *)&why);
    goto LAB_0010f75c;
  }
  pvVar5 = UntypedFunctionMockerBase::MockObject(&this->super_UntypedFunctionMockerBase);
  CVar2 = Mock::GetReactionOnUninterestingCalls(pvVar5);
  if (CVar2 == kWarn) {
    severity = kWarning;
LAB_0010f6e2:
    bVar1 = LogIsVisible(severity);
    if (!bVar1) {
      pcVar4 = UntypedFunctionMockerBase::Name(&this->super_UntypedFunctionMockerBase);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&why,pcVar4,(allocator<char> *)&loc);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     "Function call: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&why);
      PerformDefaultAction(this,args,(string *)&ss);
      std::__cxx11::string::~string((string *)&ss);
      std::__cxx11::string::~string((string *)&why);
      return;
    }
  }
  else if (CVar2 == kAllow) {
    severity = kInfo;
    goto LAB_0010f6e2;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  UntypedDescribeUninterestingCall(this,args,local_4b8);
  _loc = CVar2;
  std::__cxx11::stringbuf::str();
  PerformAction(this,(void *)0x0,args,(string *)&why);
  std::__cxx11::string::~string((string *)&why);
  UntypedFunctionMockerBase::UninterestingCallCleanupHandler::~UninterestingCallCleanupHandler
            ((UninterestingCallCleanupHandler *)&loc);
LAB_0010f75c:
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
  // See the definition of untyped_expectations_ for why access to it
  // is unprotected here.
  if (untyped_expectations_.size() == 0) {
    // No expectation is set on this mock method - we have an
    // uninteresting call.

    // We must get Google Mock's reaction on uninteresting calls
    // made on this mock object BEFORE performing the action,
    // because the action may DELETE the mock object and make the
    // following expression meaningless.
    const CallReaction reaction =
        Mock::GetReactionOnUninterestingCalls(MockObject());

    // True if and only if we need to print this call's arguments and return
    // value.  This definition must be kept in sync with
    // the behavior of ReportUninterestingCall().
    const bool need_to_report_uninteresting_call =
        // If the user allows this uninteresting call, we print it
        // only when they want informational messages.
        reaction == kAllow ? LogIsVisible(kInfo) :
                           // If the user wants this to be a warning, we print
                           // it only when they want to see warnings.
            reaction == kWarn
            ? LogIsVisible(kWarning)
            :
            // Otherwise, the user wants this to be an error, and we
            // should always print detailed information in the error.
            true;

    if (!need_to_report_uninteresting_call) {
      // Perform the action without printing the call information.
      return this->PerformDefaultAction(
          std::move(args), "Function call: " + std::string(Name()));
    }

    // Warns about the uninteresting call.
    ::std::stringstream ss;
    this->UntypedDescribeUninterestingCall(&args, &ss);

    // Perform the action, print the result, and then report the uninteresting
    // call.
    //
    // We use RAII to do the latter in case R is void or a non-moveable type. In
    // either case we can't assign it to a local variable.
    //
    // Note that std::bind() is essential here.
    // We *don't* use any local callback types (like lambdas).
    // Doing so slows down compilation dramatically because the *constructor* of
    // std::function<T> is re-instantiated with different template
    // parameters each time.
    const UninterestingCallCleanupHandler report_uninteresting_call = {reaction,
                                                                       ss};

    return PerformActionAndPrintResult(nullptr, std::move(args), ss.str(), ss);
  }

  bool is_excessive = false;
  ::std::stringstream ss;
  ::std::stringstream why;
  ::std::stringstream loc;
  const void* untyped_action = nullptr;

  // The UntypedFindMatchingExpectation() function acquires and
  // releases g_gmock_mutex.

  const ExpectationBase* const untyped_expectation =
      this->UntypedFindMatchingExpectation(&args, &untyped_action,
                                           &is_excessive, &ss, &why);
  const bool found = untyped_expectation != nullptr;

  // True if and only if we need to print the call's arguments
  // and return value.
  // This definition must be kept in sync with the uses of Expect()
  // and Log() in this function.
  const bool need_to_report_call =
      !found || is_excessive || LogIsVisible(kInfo);
  if (!need_to_report_call) {
    // Perform the action without printing the call information.
    return PerformAction(untyped_action, std::move(args), "");
  }

  ss << "    Function call: " << Name();
  this->UntypedPrintArgs(&args, &ss);

  // In case the action deletes a piece of the expectation, we
  // generate the message beforehand.
  if (found && !is_excessive) {
    untyped_expectation->DescribeLocationTo(&loc);
  }

  // Perform the action, print the result, and then fail or log in whatever way
  // is appropriate.
  //
  // We use RAII to do the latter in case R is void or a non-moveable type. In
  // either case we can't assign it to a local variable.
  //
  // Note that we *don't* use any local callback types (like lambdas) here.
  // Doing so slows down compilation dramatically because the *constructor* of
  // std::function<T> is re-instantiated with different template
  // parameters each time.
  const FailureCleanupHandler handle_failures = {
      ss, why, loc, untyped_expectation, found, is_excessive};

  return PerformActionAndPrintResult(untyped_action, std::move(args), ss.str(),
                                     ss);
}